

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_adaptive_quantize_sse2.c
# Opt level: O0

void highbd_mul_shift_sse2(__m128i *x,__m128i *y,__m128i *p,int shift)

{
  ulong in_RCX;
  ulong uVar1;
  ulong *in_RDX;
  longlong in_RSI;
  longlong in_RDI;
  ulong extraout_XMM0_Qa;
  ulong extraout_XMM0_Qa_00;
  ulong extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  __m128i a;
  __m128i a_00;
  __m128i sign_00;
  __m128i sign_01;
  __m128i sign_02;
  __m128i alVar2;
  __m128i mask;
  __m128i mult_hi;
  __m128i prod_hi;
  __m128i prod_lo;
  __m128i abs_y;
  __m128i sign_hi;
  __m128i sign_lo;
  __m128i sign;
  
  alVar2[1] = in_RSI;
  alVar2[0] = in_RDI;
  sign_00[1] = in_RCX;
  sign_00[0] = (longlong)in_RDX;
  uVar1 = in_RCX;
  alVar2 = invert_sign_32_sse2(alVar2,sign_00);
  sign_01[0] = alVar2[1];
  a[1] = in_RSI;
  a[0] = in_RDI;
  sign_01[1] = uVar1;
  alVar2 = highbd_invert_sign_64bit_sse2(a,sign_01);
  sign_02[0] = alVar2[1];
  a_00[1] = in_RSI;
  a_00[0] = in_RDI;
  sign_02[1] = uVar1;
  highbd_invert_sign_64bit_sse2(a_00,sign_02);
  *in_RDX = extraout_XMM0_Qa >> (in_RCX & 0xffffffff) & 0xffffffff |
            (extraout_XMM0_Qa_00 >> (in_RCX & 0xffffffff)) << 0x20;
  in_RDX[1] = extraout_XMM0_Qb >> (in_RCX & 0xffffffff) & 0xffffffff |
              extraout_XMM0_Qb_00 >> (in_RCX & 0xffffffff);
  return;
}

Assistant:

static inline void highbd_mul_shift_sse2(const __m128i *x, const __m128i *y,
                                         __m128i *p, const int shift) {
  __m128i sign = _mm_srai_epi32(*y, 31);
  __m128i sign_lo = _mm_unpacklo_epi32(sign, sign);
  __m128i sign_hi = _mm_unpackhi_epi32(sign, sign);
  __m128i abs_y = invert_sign_32_sse2(*y, sign);
  __m128i prod_lo = _mm_mul_epu32(*x, abs_y);
  __m128i prod_hi = _mm_srli_epi64(*x, 32);
  const __m128i mult_hi = _mm_srli_epi64(abs_y, 32);
  prod_hi = _mm_mul_epu32(prod_hi, mult_hi);
  prod_lo = highbd_invert_sign_64bit_sse2(prod_lo, sign_lo);
  prod_hi = highbd_invert_sign_64bit_sse2(prod_hi, sign_hi);

  prod_lo = _mm_srli_epi64(prod_lo, shift);
  const __m128i mask = _mm_set_epi32(0, -1, 0, -1);
  prod_lo = _mm_and_si128(prod_lo, mask);
  prod_hi = _mm_srli_epi64(prod_hi, shift);

  prod_hi = _mm_slli_epi64(prod_hi, 32);
  *p = _mm_or_si128(prod_lo, prod_hi);
}